

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_piece_hashed
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  _Atomic_word *p_Var1;
  mutex_type *pmVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  session_interface *psVar8;
  error_category *peVar9;
  ulong_long_type uVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  bool bVar14;
  generic_error_category *pgVar15;
  char cVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  tribool tVar20;
  uint uVar21;
  int64_t file_offset;
  long lVar22;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  file_storage *this_00;
  undefined4 extraout_var_04;
  long *plVar23;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int iVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  element_type *peVar28;
  ulong uVar29;
  char cVar30;
  piece_block block;
  piece_index_t pVar31;
  error_code eVar32;
  span<const_libtorrent::digest32<256L>_> block_hashes_00;
  peer_request pVar33;
  undefined1 local_c8 [8];
  generic_error_category *pgStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer local_a8;
  pointer local_98;
  int local_90;
  uint local_8c;
  undefined1 local_88 [40];
  long *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    return;
  }
  if ((this->field_0x5e0 & 4) != 0) {
    return;
  }
  state_updated(this);
  iVar24 = (this->m_num_checked_pieces).m_val + 1;
  (this->m_num_checked_pieces).m_val = iVar24;
  if ((error->ec).val_ != 0) {
    local_c8 = (undefined1  [8])0x100000002;
    pgStack_c0 = &boost::system::detail::cat_holder<void>::generic_category_instance;
    iVar24 = (*((error->ec).cat_)->_vptr_error_category[2])();
    if (((char)iVar24 == '\0') &&
       (iVar24 = (*(pgStack_c0->super_error_category)._vptr_error_category[3])
                           (pgStack_c0,error,(ulong)local_c8 & 0xffffffff), (char)iVar24 == '\0')) {
      if ((DAT_004ecee8 != 0x8fafd21e25c5e09b) && (DAT_004ecee8 != 0xb2ab117a257edf0d)) {
        (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                  (&boost::asio::error::get_misc_category()::instance);
      }
      if ((error->ec).val_ == 2) {
        peVar9 = (error->ec).cat_;
        bVar17 = peVar9->id_ == DAT_004ecee8;
        if (DAT_004ecee8 == 0) {
          bVar17 = peVar9 == (error_category *)&boost::asio::error::get_misc_category()::instance;
        }
        if (bVar17) goto LAB_0031304c;
      }
      eVar32 = errors::make_error_code(file_too_short);
      if ((error->ec).val_ != eVar32.val_) {
LAB_0031329f:
        this->m_checking_piece = 0;
        this->m_num_checked_pieces = 0;
        iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var_02,iVar24) + 0x68) & 0x49) != 0) {
          iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          resolve_filename_abi_cxx11_
                    ((string *)local_c8,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
          get_handle((torrent *)(local_88 + 0x20));
          alert_manager::
          emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                    ((alert_manager *)CONCAT44(extraout_var_03,iVar24),&error->ec,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &error->operation,(torrent_handle *)(local_88 + 0x20));
          if (local_60 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              lVar22 = (long)local_60 + 0xc;
              iVar24 = *(int *)lVar22;
              *(int *)lVar22 = *(int *)lVar22 + -1;
              UNLOCK();
            }
            else {
              iVar24 = *(int *)((long)local_60 + 0xc);
              *(int *)((long)local_60 + 0xc) = iVar24 + -1;
            }
            if (iVar24 == 1) {
              (**(code **)(*local_60 + 0x18))();
            }
          }
          if (local_c8 != (undefined1  [8])&local_b8) {
            operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
          }
        }
        iVar24 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar24 != '\0') {
          uVar21 = (error->ec).val_;
          peVar9 = (error->ec).cat_;
          (*peVar9->_vptr_error_category[4])(local_c8,peVar9,(ulong)uVar21);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"on_piece_hashed, fatal disk error: (%d) %s",(ulong)uVar21,local_c8);
          if (local_c8 != (undefined1  [8])&local_b8) {
            operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
          }
        }
        auto_managed(this,false);
        pause(this);
        set_error(this,&error->ec,(file_index_t)(int)*(int3 *)&error->field_0x10);
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x2c])();
        return;
      }
      peVar9 = (error->ec).cat_;
      uVar10 = (eVar32.cat_)->id_;
      bVar17 = peVar9->id_ == uVar10;
      if (uVar10 == 0) {
        bVar17 = peVar9 == eVar32.cat_;
      }
      if (!bVar17) goto LAB_0031329f;
    }
LAB_0031304c:
    peVar28 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    file_offset = file_storage::file_size
                            (&peVar28->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10);
    pVar33 = file_storage::map_file
                       (&peVar28->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10,file_offset
                        ,0);
    iVar24 = (this->m_num_checked_pieces).m_val;
    pVar31 = pVar33.piece.m_val;
    iVar6 = (this->m_checking_piece).m_val;
    iVar25 = pVar31.m_val - iVar6;
    if (iVar25 != 0 && iVar6 <= pVar31.m_val) {
      iVar24 = iVar24 + iVar25;
      (this->m_num_checked_pieces).m_val = iVar24;
      (this->m_checking_piece).m_val = pVar31.m_val;
    }
  }
  psVar8 = (this->super_torrent_hot_members).m_ses;
  lVar27 = (long)(((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_files).m_num_pieces;
  lVar22 = ((long)iVar24 * 1000000) / lVar27;
  *(short *)&this->field_0x604 = (short)lVar22;
  this->field_0x606 = this->field_0x606 & 0xf0 | (byte)((ulong)lVar22 >> 0x10) & 0xf;
  iVar24 = (*(psVar8->super_session_logger)._vptr_session_logger[0x2e])
                     (psVar8,lVar27,((long)iVar24 * 1000000) % lVar27);
  local_c8 = (undefined1  [8])(CONCAT44(extraout_var_01,iVar24) + 0x438);
  pgStack_c0 = (generic_error_category *)((ulong)pgStack_c0 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
  pgStack_c0 = (generic_error_category *)CONCAT71(pgStack_c0._1_7_,1);
  uVar21 = *(uint *)(CONCAT44(extraout_var_01,iVar24) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  cVar30 = '\x01';
  tVar20.value = true_value;
  if ((uVar21 >> 0x16 & 1) == 0) {
    bVar17 = digest32<160L>::is_all_zeros
                       (&(((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_info_hash).v1);
    if (bVar17) {
      bVar17 = digest32<256L>::is_all_zeros
                         (&(((this->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_info_hash).v2);
      uVar29 = CONCAT71(extraout_var,bVar17) & 0xffffffff;
      cVar30 = '\x02';
      tVar20.value = indeterminate_value;
      cVar16 = '\x02';
      if ((char)uVar29 == '\0') {
LAB_003131ec:
        cVar30 = cVar16;
        block_hashes_00.m_len = uVar29;
        block_hashes_00.m_ptr =
             (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                *)&(block_hashes->
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ).
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl)->_M_impl).super__Vector_impl_data._M_start;
        tVar20 = on_blocks_hashed(this,piece,block_hashes_00);
      }
    }
    else {
      local_98 = (pointer)block_hashes;
      torrent_info::hash_for_piece
                ((sha1_hash *)local_c8,
                 (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 piece);
      bVar19 = local_b8._M_allocated_capacity._0_4_ == (piece_hash->m_number)._M_elems[4];
      bVar14 = local_c8 == (undefined1  [8])*(mutex_type **)(piece_hash->m_number)._M_elems;
      bVar17 = pgStack_c0 ==
               (generic_error_category *)*(ulong *)((piece_hash->m_number)._M_elems + 2);
      bVar18 = digest32<256L>::is_all_zeros
                         (&(((this->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_info_hash).v2);
      uVar29 = CONCAT71(extraout_var_00,bVar18) & 0xffffffff;
      cVar30 = ((bVar19 && bVar14) && bVar17) && bVar18;
      tVar20.value = indeterminate_value;
      block_hashes = (vector<sha256_hash> *)local_98;
      if (((char)uVar29 == '\0') && (cVar16 = '\x01', (bVar19 && bVar14) && bVar17))
      goto LAB_003131ec;
    }
  }
  if (cVar30 == '\0' || tVar20.value == true_value) {
    if (((tVar20.value != false_value && cVar30 != '\x01') && cVar30 == '\0') &&
        tVar20.value == true_value) {
LAB_0031338f:
      handle_inconsistent_hashes(this,piece);
      return;
    }
    if (cVar30 != '\0') goto LAB_0031339e;
    if (tVar20.value != true_value) goto LAB_00313446;
  }
  else {
    if (cVar30 == '\x01' && tVar20.value == false_value) goto LAB_0031338f;
LAB_0031339e:
    if (tVar20.value != true_value && cVar30 != '\x01') {
      if (tVar20.value == indeterminate_value && (error->ec).val_ == 0) {
        need_picker(this);
        uVar21 = piece_picker::blocks_in_piece
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,piece);
        if (0 < (int)uVar21) {
          block.block_index = 0;
          block.piece_index.m_val = piece.m_val;
          uVar29 = (ulong)uVar21;
          do {
            piece_picker::mark_as_finished
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       block,(torrent_peer *)0x0);
            block = (piece_block)((long)block + 0x100000000);
            uVar29 = uVar29 - 1;
          } while (uVar29 != 0);
        }
      }
      goto LAB_00313446;
    }
  }
  if (((this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
       (piece_picker *)0x0) || (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0)) {
    need_picker(this);
    piece_picker::we_have
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
    bVar5 = (this->m_need_save_resume_data).m_val;
    if ((bVar5 & 0x10) == 0) {
      (this->m_need_save_resume_data).m_val = bVar5 | 0x10;
      state_updated(this);
    }
    update_gauge(this);
  }
  we_have(this,piece,false);
LAB_00313446:
  peVar28 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar24 = (peVar28->m_files).m_num_pieces;
  pVar31.m_val = (this->m_checking_piece).m_val;
  if ((pVar31.m_val < iVar24) &&
     ((this->super_torrent_hot_members).m_picker._M_t.
      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
      (piece_picker *)0x0)) {
    do {
      bVar17 = piece_picker::have_piece
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,pVar31);
      peVar28 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!bVar17) {
        iVar24 = (peVar28->m_files).m_num_pieces;
        break;
      }
      uVar3 = this->m_checking_piece;
      uVar4 = this->m_num_checked_pieces;
      pVar31.m_val = uVar3 + 1;
      this->m_checking_piece = (piece_index_t)pVar31.m_val;
      this->m_num_checked_pieces = (piece_index_t)(uVar4 + 1);
      iVar24 = (peVar28->m_files).m_num_pieces;
    } while (pVar31.m_val < iVar24);
  }
  if ((this->m_num_checked_pieces).m_val < iVar24) {
    uVar29 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if ((((uVar29 & 0xe00000008000000) == 0x200000000000000) && ((uVar29 & 0x14000000) == 0)) &&
       ((this->m_error).failed_ == false)) {
      if ((this->m_checking_piece).m_val < iVar24) {
        bVar17 = digest32<160L>::is_all_zeros(&(peVar28->m_info_hash).v1);
        bVar19 = digest32<256L>::is_all_zeros
                           (&(((this->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_info_hash).v2);
        if (!bVar19) {
          this_00 = torrent_info::orig_files
                              ((this->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          iVar24 = file_storage::blocks_in_piece2
                             (this_00,(piece_index_t)(this->m_checking_piece).m_val);
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          resize(&block_hashes->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ,(long)iVar24);
        }
        pdVar11 = (block_hashes->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ).
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar12 = (block_hashes->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ).
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[4])();
        local_88._24_8_ = CONCAT44(extraout_var_04,iVar24);
        local_8c = (this->m_storage).m_idx.m_val;
        local_90 = (this->m_checking_piece).m_val;
        local_98 = pdVar11;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        local_88._16_8_ =
             (block_hashes->
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>)
             .
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pdVar11 = (block_hashes->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ).
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_b8._M_local_buf =
             *(char (*) [16])
              &(block_hashes->
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ).
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data;
        pdVar13 = (block_hashes->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ).
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (block_hashes->
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (block_hashes->
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (block_hashes->
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48._0_16_ = (undefined1  [16])0x0;
        local_58 = (undefined1  [16])0x0;
        local_a8 = pdVar13;
        plVar23 = (long *)operator_new(0x28);
        pgVar15 = pgStack_c0;
        pgStack_c0 = (generic_error_category *)0x0;
        *plVar23 = (long)local_c8;
        plVar23[1] = (long)pgVar15;
        local_c8 = (undefined1  [8])0x0;
        plVar23[2] = local_88._16_8_;
        plVar23[3] = (long)pdVar11;
        plVar23[4] = (long)pdVar13;
        local_a8 = (pointer)0x0;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )0x0;
        local_58._0_8_ = plVar23;
        local_48._8_8_ =
             ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
             ::_M_invoke;
        local_48._0_8_ =
             ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
             ::_M_manager;
        (**(code **)(*(long *)(file_storage *)local_88._24_8_ + 0x20))
                  (local_88._24_8_,local_8c,local_90,local_98,(long)pdVar12 - (long)local_98 >> 5,
                   !bVar17 << 5 | 0x18,local_58);
        if ((pointer)local_48._0_8_ != (pointer)0x0) {
          (*(code *)local_48._0_8_)(local_58,local_58,3);
        }
        on_piece_hashed(libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)
        ::$_0::~__0((__0 *)local_c8);
        (this->m_checking_piece).m_val = (this->m_checking_piece).m_val + 1;
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"on_piece_hashed, m_checking_piece: %d",
                   (ulong)(uint)(this->m_checking_piece).m_val);
      }
    }
    else {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"on_piece_hashed, checking paused");
      if (((this->m_checking_piece).m_val == (this->m_num_checked_pieces).m_val) &&
         (iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])(),
         (*(uint *)(CONCAT44(extraout_var_06,iVar24) + 0x68) & 0x40) != 0)) {
        iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_88);
        alert_manager::emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_07,iVar24),(torrent_handle *)local_88);
        if ((piece_picker *)local_88._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_88._8_8_ + 0xc);
            iVar24 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar24 = *(_Atomic_word *)(local_88._8_8_ + 0xc);
            *(int *)(local_88._8_8_ + 0xc) = iVar24 + -1;
          }
          if (iVar24 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
    }
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"on_piece_hashed, completed");
    iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    lVar22 = CONCAT44(extraout_var_05,iVar24);
    pmVar2 = (mutex_type *)(lVar22 + 0x438);
    pgStack_c0 = (generic_error_category *)((ulong)pgStack_c0 & 0xffffffffffffff00);
    local_c8 = (undefined1  [8])pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
    pgStack_c0._0_1_ = true;
    uVar21 = *(uint *)(lVar22 + 0x24c);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
    uVar26 = 0x7fffffff;
    if (uVar21 < 0x7fffffff) {
      uVar26 = uVar21;
    }
    pgStack_c0._0_1_ = false;
    local_c8 = (undefined1  [8])pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
    pgStack_c0._0_1_ = true;
    uVar21 = *(uint *)(lVar22 + 0x250);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
    pgStack_c0._0_1_ = false;
    local_c8 = (undefined1  [8])pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
    pgStack_c0 = (generic_error_category *)CONCAT71(pgStack_c0._1_7_,true);
    uVar7 = *(uint *)(lVar22 + 0x264);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
    iVar24 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x1c])();
    if (0x7ffffffe < uVar7) {
      uVar7 = 0x7fffffff;
    }
    if (uVar21 < uVar26) {
      uVar26 = uVar21;
    }
    if (0x7ffffffe < uVar26) {
      uVar26 = 0x7fffffff;
    }
    if (uVar7 < uVar26) {
      uVar26 = uVar7;
    }
    if (((int)uVar26 < iVar24) && ((this->field_0x600 & 1) != 0)) {
      set_paused(this,true,(pause_flags_t)0x0);
    }
    files_checked(this);
    this->m_checking_piece = 0;
    this->m_num_checked_pieces = 0;
  }
  return;
}

Assistant:

void torrent::on_piece_hashed(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece, sha1_hash const& piece_hash
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort) return;
		if (m_deleted) return;

		state_updated();

		++m_num_checked_pieces;

		if (error)
		{
			if (error.ec == boost::system::errc::no_such_file_or_directory
				|| error.ec == boost::asio::error::eof
				|| error.ec == lt::errors::file_too_short
#ifdef TORRENT_WINDOWS
				|| error.ec == error_code(ERROR_HANDLE_EOF, system_category())
#endif
				)
			{
				TORRENT_ASSERT(error.file() >= file_index_t(0));

				// skip this file by updating m_checking_piece to the first piece following it
				file_storage const& st = m_torrent_file->files();
				std::int64_t file_size = st.file_size(error.file());
				piece_index_t last = st.map_file(error.file(), file_size, 0).piece;
				if (m_checking_piece < last)
				{
					int diff = static_cast<int>(last) - static_cast<int>(m_checking_piece);
					m_num_checked_pieces = piece_index_t(static_cast<int>(m_num_checked_pieces) + diff);
					m_checking_piece = last;
				}
			}
			else
			{
				m_checking_piece = piece_index_t{0};
				m_num_checked_pieces = piece_index_t{0};
				if (m_ses.alerts().should_post<file_error_alert>())
					m_ses.alerts().emplace_alert<file_error_alert>(error.ec,
						resolve_filename(error.file()), error.operation, get_handle());

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("on_piece_hashed, fatal disk error: (%d) %s", error.ec.value()
						, error.ec.message().c_str());
				}
#endif
				auto_managed(false);
				pause();
				set_error(error.ec, error.file());

				// recalculate auto-managed torrents sooner
				// in order to start checking the next torrent
				m_ses.trigger_auto_manage();
				return;
			}
		}

		m_progress_ppm = std::uint32_t(std::int64_t(static_cast<int>(m_num_checked_pieces))
			* 1000000 / torrent_file().num_pieces());

		boost::tribool hash_passed[2]
			= { boost::indeterminate, boost::indeterminate };

		if (!settings().get_bool(settings_pack::disable_hash_checks))
		{
			if (torrent_file().info_hashes().has_v1())
				hash_passed[0] = piece_hash == m_torrent_file->hash_for_piece(piece);

			// if the v1 hash failed the check, don't add the v2 hashes to the
			// merkle tree. They are most likely invalid.
			if (torrent_file().info_hashes().has_v2() && !bool(hash_passed[0] == false))
			{
				hash_passed[1] = on_blocks_hashed(piece, block_hashes);
			}
		}
		else
		{
			hash_passed[0] = hash_passed[1] = true;
		}

		if ((hash_passed[0] && !hash_passed[1]) || (!hash_passed[0] && hash_passed[1]))
		{
			handle_inconsistent_hashes(piece);
			return;
		}
		else if (hash_passed[0] || hash_passed[1])
		{
			if (has_picker() || !m_have_all)
			{
				need_picker();
				m_picker->we_have(piece);
				set_need_save_resume(torrent_handle::if_download_progress);
				update_gauge();
			}
			we_have(piece);
		}
		else if (!error
			&& boost::indeterminate(hash_passed[0])
			&& boost::indeterminate(hash_passed[1]))
		{
			// The data exists but we don't have the hashes needed to verify
			// it yet. This is a special case because we want to say we have
			// the piece once the hash is verified and not download the data
			// unless the hash check fails. To get this effect we setup the
			// piece's state in the piece picker so that it looks like a piece
			// which is finished but not hash checked.
			need_picker();
			int const blocks_in_piece = m_picker->blocks_in_piece(piece);
			for (int i = 0; i < blocks_in_piece; ++i)
				m_picker->mark_as_finished(piece_block(piece, i), nullptr);
		}

		if (m_checking_piece < m_torrent_file->end_piece() && has_picker())
		{
			// skip pieces we already have
			while (m_picker->have_piece(m_checking_piece))
			{
				++m_checking_piece;
				++m_num_checked_pieces;
				if (m_checking_piece >= m_torrent_file->end_piece())
				{
					// actually, we already have outstanding jobs for
					// the remaining pieces. We just need to wait for them
					// to finish
					break;
				}
			}
		}

		if (m_num_checked_pieces < m_torrent_file->end_piece())
		{
			// we paused the checking
			if (!should_check_files())
			{
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("on_piece_hashed, checking paused");
#endif
				if (m_checking_piece == m_num_checked_pieces)
				{
					// we are paused, and we just completed the last outstanding job.
					// now we can be considered paused
					if (alerts().should_post<torrent_paused_alert>())
						alerts().emplace_alert<torrent_paused_alert>(get_handle());
				}
				return;
			}

			if (m_checking_piece >= m_torrent_file->end_piece())
				return;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;

			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			if (torrent_file().info_hashes().has_v2())
				block_hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(block_hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes = std::move(block_hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& e)
				{ self->on_piece_hashed(std::move(hashes), p, h, e); });
			++m_checking_piece;
			m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("on_piece_hashed, m_checking_piece: %d"
				, static_cast<int>(m_checking_piece));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("on_piece_hashed, completed");
#endif

		auto const& pack = settings();
		auto get_int_setting = [&pack](int const name) {
			int const v = pack.get_int(name);
			if (v < 0) return std::numeric_limits<int>::max();
			return v;
		};
		int const limit = std::min({
			get_int_setting(settings_pack::active_downloads)
			, get_int_setting(settings_pack::active_seeds)
			, get_int_setting(settings_pack::active_limit)});
		int const num_torrents = m_ses.num_torrents();
		if (m_auto_managed && num_torrents > limit)
		{
			// if we're auto managed and we've reached one of the limits. Assume
			// we need to be paused until the auto managed logic runs again
			// (which is triggered further down)
			set_paused(true);
		}

		// we're done checking! (this should cause a call to trigger_auto_manage)
		files_checked();

		// reset the checking state
		m_checking_piece = piece_index_t(0);
		m_num_checked_pieces = piece_index_t(0);
	}
	catch (...) { handle_exception(); }